

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_copy.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::Bind
          (BoundStatement *__return_storage_ptr__,Binder *this,CopyStatement *stmt,
          CopyToType copy_to_type)

{
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *this_00;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  pointer pbVar2;
  pointer pcVar3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  Binder *this_01;
  pointer pCVar7;
  BaseTableRef *this_02;
  pointer pBVar8;
  SelectNode *this_03;
  pointer pSVar9;
  StarExpression *pSVar10;
  StatementProperties *pSVar11;
  undefined7 in_register_00000009;
  pointer pbVar12;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_88;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_80;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_78;
  undefined4 local_6c;
  string local_68;
  CopyStatement *local_48;
  BoundStatement *local_40;
  Binder *local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,copy_to_type);
  this_00 = &stmt->info;
  local_38 = this;
  pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  if ((pCVar7->is_from == false) &&
     (pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         (this_00),
     (pCVar7->select_statement).
     super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
     super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
     super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
     super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0)) {
    local_48 = stmt;
    local_40 = __return_storage_ptr__;
    this_02 = (BaseTableRef *)operator_new(0xd0);
    BaseTableRef::BaseTableRef(this_02);
    local_88._M_head_impl = this_02;
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_00);
    pBVar8 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_88);
    ::std::__cxx11::string::_M_assign((string *)&pBVar8->catalog_name);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_00);
    pBVar8 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_88);
    ::std::__cxx11::string::_M_assign((string *)&pBVar8->schema_name);
    unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->(this_00);
    pBVar8 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
             operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                         *)&local_88);
    ::std::__cxx11::string::_M_assign((string *)&pBVar8->table_name);
    this_03 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(this_03);
    _Var5._M_head_impl = local_88._M_head_impl;
    local_88._M_head_impl = (BaseTableRef *)0x0;
    local_78._M_head_impl = (QueryNode *)this_03;
    pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
             operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_78);
    _Var1._M_head_impl =
         (pSVar9->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar9->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
         &(_Var5._M_head_impl)->super_TableRef;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    }
    pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_00);
    if ((pCVar7->select_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar7->select_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)&local_78);
      pSVar10 = (StarExpression *)operator_new(0x110);
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      StarExpression::StarExpression(pSVar10,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      local_80._M_head_impl = (ParsedExpression *)pSVar10;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar9->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_80);
      if ((StarExpression *)local_80._M_head_impl != (StarExpression *)0x0) {
        (*((BaseExpression *)&((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
    }
    else {
      pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                         (this_00);
      pbVar12 = (pCVar7->select_list).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pCVar7->select_list).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar12 != pbVar2) {
        do {
          pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)&local_78);
          pSVar10 = (StarExpression *)operator_new(0x50);
          pcVar3 = (pbVar12->_M_dataplus)._M_p;
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar3,pcVar3 + pbVar12->_M_string_length);
          ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)pSVar10,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          local_80._M_head_impl = (ParsedExpression *)pSVar10;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar9->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_80);
          if ((StarExpression *)local_80._M_head_impl != (StarExpression *)0x0) {
            (*((BaseExpression *)
              &((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar2);
      }
    }
    _Var6._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (QueryNode *)0x0;
    pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       (this_00);
    _Var4._M_head_impl =
         (pCVar7->select_statement).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar7->select_statement).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var4._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_QueryNode + 8))();
    }
    __return_storage_ptr__ = local_40;
    stmt = local_48;
    if (local_78._M_head_impl != (QueryNode *)0x0) {
      (*(local_78._M_head_impl)->_vptr_QueryNode[1])();
    }
    if (local_88._M_head_impl != (BaseTableRef *)0x0) {
      (*((local_88._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
    }
  }
  this_01 = local_38;
  pSVar11 = GetStatementProperties(local_38);
  pSVar11->allow_stream_result = false;
  pSVar11->return_type = CHANGED_ROWS;
  pCVar7 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     (this_00);
  if (pCVar7->is_from == true) {
    BindCopyFrom(__return_storage_ptr__,this_01,stmt);
  }
  else {
    BindCopyTo(__return_storage_ptr__,this_01,stmt,(CopyToType)local_6c);
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(CopyStatement &stmt, CopyToType copy_to_type) {
	if (!stmt.info->is_from && !stmt.info->select_statement) {
		// copy table into file without a query
		// generate SELECT * FROM table;
		auto ref = make_uniq<BaseTableRef>();
		ref->catalog_name = stmt.info->catalog;
		ref->schema_name = stmt.info->schema;
		ref->table_name = stmt.info->table;

		auto statement = make_uniq<SelectNode>();
		statement->from_table = std::move(ref);
		if (!stmt.info->select_list.empty()) {
			for (auto &name : stmt.info->select_list) {
				statement->select_list.push_back(make_uniq<ColumnRefExpression>(name));
			}
		} else {
			statement->select_list.push_back(make_uniq<StarExpression>());
		}
		stmt.info->select_statement = std::move(statement);
	}

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::CHANGED_ROWS;
	if (stmt.info->is_from) {
		return BindCopyFrom(stmt);
	} else {
		return BindCopyTo(stmt, copy_to_type);
	}
}